

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullWriter.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::NullWriter::NullWriter
          (NullWriter *this,IO *io,string *name,Mode mode,Comm *comm)

{
  NullWriterImpl *pNVar1;
  allocator local_51;
  Comm local_50;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"NullWriter",&local_51);
  helper::Comm::Comm(&local_50,comm);
  Engine::Engine(&this->super_Engine,&local_48,io,name,mode,&local_50);
  helper::Comm::~Comm(&local_50);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__NullWriter_0081ff00;
  pNVar1 = (NullWriterImpl *)operator_new(0x10);
  pNVar1->CurrentStep = 0;
  pNVar1->IsInStep = false;
  pNVar1->IsOpen = true;
  (this->Impl)._M_t.
  super___uniq_ptr_impl<adios2::core::engine::NullWriter::NullWriterImpl,_std::default_delete<adios2::core::engine::NullWriter::NullWriterImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_adios2::core::engine::NullWriter::NullWriterImpl_*,_std::default_delete<adios2::core::engine::NullWriter::NullWriterImpl>_>
  .super__Head_base<0UL,_adios2::core::engine::NullWriter::NullWriterImpl_*,_false>._M_head_impl =
       pNVar1;
  (this->super_Engine).m_IsOpen = true;
  return;
}

Assistant:

NullWriter::NullWriter(IO &io, const std::string &name, const Mode mode, helper::Comm comm)
: Engine("NullWriter", io, name, mode, std::move(comm)), Impl(new NullWriter::NullWriterImpl)
{
    m_IsOpen = true;
}